

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::~ConsumerEndpointImpl
          (ConsumerEndpointImpl *this)

{
  ~ConsumerEndpointImpl(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TracingServiceImpl::ConsumerEndpointImpl::~ConsumerEndpointImpl() {
  service_->DisconnectConsumer(this);
  consumer_->OnDisconnect();
}